

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

AST_Binary_Expression * get_binary_expression_tree(AST *left,AST *right,AST_Type type)

{
  AST_Binary_Expression *pAVar1;
  
  pAVar1 = (AST_Binary_Expression *)malloc(0x20);
  pAVar1->type = type;
  pAVar1->left = left;
  pAVar1->right = right;
  return pAVar1;
}

Assistant:

struct AST_Binary_Expression* get_binary_expression_tree(struct AST *left,struct AST *right,enum AST_Type type)
{
	struct AST_Binary_Expression *ret;
	ret=malloc(sizeof(struct AST_Binary_Expression));
	ret->type=type;
	ret->left=left;
	ret->right=right;

	return ret;
}